

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface_ProblemToPolicyDiscretePure.h
# Opt level: O2

LIndex __thiscall
Interface_ProblemToPolicyDiscretePure::GetNrPolicies
          (Interface_ProblemToPolicyDiscretePure *this,Index ag,PolicyDomainCategory cat,
          size_t depth)

{
  long lVar1;
  EOverflow *this_00;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = -1;
  uVar2 = 1;
  do {
    lVar1 = (**(code **)(*(long *)this + 0x28))(this,ag,cat,depth);
    lVar3 = lVar3 + 1;
    if (lVar3 == lVar1) {
      return uVar2;
    }
    lVar1 = (**(code **)(*(long *)this + 0x20))(this,ag);
    bVar4 = uVar2 <= lVar1 * uVar2;
    uVar2 = lVar1 * uVar2;
  } while (bVar4);
  this_00 = (EOverflow *)__cxa_allocate_exception(0x28);
  EOverflow::EOverflow
            (this_00,"Interface_ProblemToPolicyDiscretePure::GetNrPolicies() overflow detected");
  __cxa_throw(this_00,&EOverflow::typeinfo,E::~E);
}

Assistant:

LIndex GetNrPolicies(Index ag,
                             PolicyGlobals::PolicyDomainCategory cat, 
                             size_t depth=MAXHORIZON) const
        {        
#if 0 // don't use powl(), we want to detect overflow
            LIndex nr_pols = 
                static_cast<LIndex>(
                    powl( GetNrActions(ag),
                          GetNrPolicyDomainElements(ag,cat,depth) ));
#endif
            LIndex nrPols=1;
            for(size_t k=0;k!=GetNrPolicyDomainElements(ag,cat,depth);++k)
            {
                LIndex nrPolsOld=nrPols;
                nrPols*=GetNrActions(ag);
                if(nrPols<nrPolsOld)
                    throw(EOverflow("Interface_ProblemToPolicyDiscretePure::GetNrPolicies() overflow detected"));
            }
            return(nrPols);
        }